

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinGlobalSinkState::ScheduleFinalize
          (HashJoinGlobalSinkState *this,Pipeline *pipeline,Event *event)

{
  pointer pJVar1;
  idx_t iVar2;
  HashJoinTableInitEvent *this_00;
  shared_ptr<duckdb::HashJoinFinalizeEvent,_true> new_finalize_event;
  shared_ptr<duckdb::HashJoinTableInitEvent,_true> new_init_event;
  undefined1 local_68 [16];
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  shared_ptr<duckdb::Event,_true> local_38;
  
  pJVar1 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->hash_table);
  iVar2 = JoinHashTable::Count(pJVar1);
  pJVar1 = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
           operator->(&this->hash_table);
  if (iVar2 == 0) {
    pJVar1->finalized = true;
  }
  else {
    JoinHashTable::AllocatePointerTable(pJVar1);
    make_shared_ptr<duckdb::HashJoinTableInitEvent,duckdb::Pipeline&,duckdb::HashJoinGlobalSinkState&>
              ((Pipeline *)local_58,(HashJoinGlobalSinkState *)pipeline);
    ::std::__shared_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<duckdb::HashJoinTableInitEvent,void>
              ((__shared_ptr<duckdb::Event,(__gnu_cxx::_Lock_policy)2> *)(local_58 + 0x10),
               (__shared_ptr<duckdb::HashJoinTableInitEvent,_(__gnu_cxx::_Lock_policy)2> *)local_58)
    ;
    Event::InsertEvent(event,(shared_ptr<duckdb::Event,_true> *)(local_58 + 0x10));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
    make_shared_ptr<duckdb::HashJoinFinalizeEvent,duckdb::Pipeline&,duckdb::HashJoinGlobalSinkState&>
              ((Pipeline *)local_68,(HashJoinGlobalSinkState *)pipeline);
    this_00 = shared_ptr<duckdb::HashJoinTableInitEvent,_true>::operator->
                        ((shared_ptr<duckdb::HashJoinTableInitEvent,_true> *)local_58);
    local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_68._0_8_;
    local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68._8_8_;
    local_68._0_8_ = (element_type *)0x0;
    local_68._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Event::InsertEvent((Event *)this_00,&local_38);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.internal.super___shared_ptr<duckdb::Event,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
  }
  return;
}

Assistant:

void HashJoinGlobalSinkState::ScheduleFinalize(Pipeline &pipeline, Event &event) {
	if (hash_table->Count() == 0) {
		hash_table->finalized = true;
		return;
	}
	hash_table->AllocatePointerTable();

	auto new_init_event = make_shared_ptr<HashJoinTableInitEvent>(pipeline, *this);
	event.InsertEvent(new_init_event);

	auto new_finalize_event = make_shared_ptr<HashJoinFinalizeEvent>(pipeline, *this);
	new_init_event->InsertEvent(std::move(new_finalize_event));
}